

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmd.c
# Opt level: O2

int genmmd_(int *neqns,int_t *xadj,shortint *adjncy,int *invp,int *perm,int_t *delta,shortint *dhead
           ,shortint *qsize,shortint *llist,shortint *marker,int_t *maxint,int_t *nofsub)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int_t tag;
  int local_84;
  int local_80;
  int local_7c;
  int *local_78;
  int *local_70;
  int *local_68;
  int local_5c;
  int local_58;
  int local_54;
  int_t *local_50;
  uint *local_48;
  shortint *local_40;
  shortint *local_38;
  
  if (0 < *neqns) {
    *nofsub = 0;
    local_78 = perm;
    local_70 = invp;
    local_68 = delta;
    local_50 = xadj;
    local_40 = adjncy;
    slu_mmdint_(neqns,xadj,adjncy,dhead,invp,perm,qsize,llist,marker);
    iVar15 = -1;
    uVar3 = *dhead;
    while (0 < (int)uVar3) {
      uVar1 = local_70[(ulong)uVar3 - 1];
      marker[(ulong)uVar3 - 1] = *maxint;
      local_70[(ulong)uVar3 - 1] = iVar15;
      iVar15 = iVar15 + -1;
      uVar3 = uVar1;
    }
    iVar15 = -iVar15;
    if (iVar15 <= *neqns) {
      tag = 1;
      *dhead = 0;
      local_38 = dhead + -1;
      local_48 = (uint *)neqns;
      iVar9 = 2;
      do {
        iVar11 = iVar9 + -1;
        piVar4 = local_38 + iVar9;
        do {
          iVar11 = iVar11 + 1;
          iVar9 = *piVar4;
          piVar4 = piVar4 + 1;
        } while (iVar9 < 1);
        iVar8 = *local_68 + iVar11;
        lVar12 = 0;
        iVar9 = iVar8;
        iVar10 = tag;
        do {
          lVar5 = (long)iVar11 + -1;
          iVar14 = -iVar11;
          while( true ) {
            iVar2 = dhead[lVar5];
            lVar13 = (long)iVar2;
            local_80 = iVar2;
            if (0 < lVar13) break;
            lVar5 = lVar5 + 1;
            iVar14 = iVar14 + -1;
            if (iVar8 <= lVar5) {
              if (iVar9 < iVar11) {
                iVar9 = iVar11;
              }
              local_84 = iVar9 + 1;
              local_7c = (int)lVar12;
              goto LAB_0010a4c2;
            }
          }
          iVar11 = local_70[lVar13 + -1];
          dhead[lVar5] = iVar11;
          if (0 < (long)iVar11) {
            local_78[(long)iVar11 + -1] = iVar14;
          }
          local_70[lVar13 + -1] = -iVar15;
          *nofsub = ((qsize[lVar13 + -1] + *nofsub) - iVar14) + -2;
          uVar3 = *local_48;
          neqns = (int *)local_48;
          if ((int)uVar3 < qsize[lVar13 + -1] + iVar15) goto LAB_0010a2af;
          tag = iVar10 + 1;
          if (*maxint <= tag) {
            tag = 1;
            uVar6 = (ulong)uVar3;
            if ((int)uVar3 < 1) {
              uVar6 = 0;
            }
            for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
              if (marker[uVar7] < *maxint) {
                marker[uVar7] = 0;
              }
            }
          }
          iVar11 = -iVar14;
          local_5c = tag;
          local_58 = (int)lVar12;
          local_54 = iVar9;
          slu_mmdelm_(&local_80,local_50,local_40,dhead,local_70,local_78,qsize,llist,marker,maxint,
                      &tag);
          iVar15 = iVar15 + qsize[lVar13 + -1];
          llist[lVar13 + -1] = local_58;
          lVar12 = lVar13;
          iVar9 = local_54;
          iVar10 = local_5c;
        } while (-1 < *local_68);
        local_84 = -iVar14;
        local_7c = iVar2;
LAB_0010a4c2:
        neqns = (int *)local_48;
        if ((int)*local_48 < iVar15) break;
        slu_mmdupd_(&local_7c,(int *)local_48,local_50,local_40,local_68,&local_84,dhead,local_70,
                    local_78,qsize,llist,marker,maxint,&tag);
        iVar9 = local_84;
      } while( true );
    }
LAB_0010a2af:
    slu_mmdnum_(neqns,local_78,local_70,qsize);
  }
  return 0;
}

Assistant:

int genmmd_(int *neqns, int_t *xadj, shortint *adjncy, 
	int *invp, int *perm, int_t *delta, shortint *dhead, 
	shortint *qsize, shortint *llist, shortint *marker, int_t *maxint, 
	int_t *nofsub)
{
    /* System generated locals */
    int i__1;

    /* Local variables */
    int_t mdeg, ehead, i, mdlmt, mdnode;
    extern /* Subroutine */
    int slu_mmdelm_(const int_t *mdnode, int_t *xadj, shortint *adjncy,
                    shortint *dhead, int *dforw, int *dbakw, shortint *qsize,
                    shortint *llist, shortint *marker, const int_t *maxint, const int_t *tag),
    slu_mmdupd_(const int_t *ehead, const int *neqns, int_t *xadj,
                shortint *adjncy, const int_t *delta, int_t *mdeg, shortint *dhead,
                int *dforw, int *dbakw, shortint *qsize, shortint *llist,
                shortint *marker, const int_t *maxint, int_t *tag),
    slu_mmdint_(const int *neqns, int_t *xadj, shortint *adjncy,
                shortint *dhead, int *dforw, int *dbakw, shortint *qsize,
                shortint *llist, shortint *marker),
    slu_mmdnum_(const int *neqns, int *perm, int *invp, shortint *qsize);

    int_t nextmd, tag, num;

/* *************************************************************** */


/* *************************************************************** */

    /* Parameter adjustments */
    --marker;
    --llist;
    --qsize;
    --dhead;
    --perm;
    --invp;
    --adjncy;
    --xadj;

    /* Function Body */
    if (*neqns <= 0) {
	return 0;
    }

/*        ------------------------------------------------ */
/*        INITIALIZATION FOR THE MINIMUM DEGREE ALGORITHM. */
/*        ------------------------------------------------ */
    *nofsub = 0;
    slu_mmdint_(neqns, &xadj[1], &adjncy[1], &dhead[1], &invp[1], &perm[1], &
	    qsize[1], &llist[1], &marker[1]);

/*        ---------------------------------------------- */
/*        NUM COUNTS THE NUMBER OF ORDERED NODES PLUS 1. */
/*        ---------------------------------------------- */
    num = 1;

/*        ----------------------------- */
/*        ELIMINATE ALL ISOLATED NODES. */
/*        ----------------------------- */
    nextmd = dhead[1];
L100:
    if (nextmd <= 0) {
	goto L200;
    }
    mdnode = nextmd;
    nextmd = invp[mdnode];
    marker[mdnode] = *maxint;
    invp[mdnode] = -num;
    ++num;
    goto L100;

L200:
/*        ---------------------------------------- */
/*        SEARCH FOR NODE OF THE MINIMUM DEGREE. */
/*        MDEG IS THE CURRENT MINIMUM DEGREE; */
/*        TAG IS USED TO FACILITATE MARKING NODES. */
/*        ---------------------------------------- */
    if (num > *neqns) {
	goto L1000;
    }
    tag = 1;
    dhead[1] = 0;
    mdeg = 2;
L300:
    if (dhead[mdeg] > 0) {
	goto L400;
    }
    ++mdeg;
    goto L300;
L400:
/*            ------------------------------------------------- */
/*            USE VALUE OF DELTA TO SET UP MDLMT, WHICH GOVERNS */
/*            WHEN A DEGREE UPDATE IS TO BE PERFORMED. */
/*            ------------------------------------------------- */
    mdlmt = mdeg + *delta;
    ehead = 0;

L500:
    mdnode = dhead[mdeg];
    if (mdnode > 0) {
	goto L600;
    }
    ++mdeg;
    if (mdeg > mdlmt) {
	goto L900;
    }
    goto L500;
L600:
/*                ---------------------------------------- */
/*                REMOVE MDNODE FROM THE DEGREE STRUCTURE. */
/*                ---------------------------------------- */
    nextmd = invp[mdnode];
    dhead[mdeg] = nextmd;
    if (nextmd > 0) {
	perm[nextmd] = -mdeg;
    }
    invp[mdnode] = -num;
    *nofsub = *nofsub + mdeg + qsize[mdnode] - 2;
    if (num + qsize[mdnode] > *neqns) {
	goto L1000;
    }
/*                ---------------------------------------------- */
/*                ELIMINATE MDNODE AND PERFORM QUOTIENT GRAPH */
/*                TRANSFORMATION.  RESET TAG VALUE IF NECESSARY. */
/*                ---------------------------------------------- */
    ++tag;
    if (tag < *maxint) {
	goto L800;
    }
    tag = 1;
    i__1 = *neqns;
    for (i = 1; i <= i__1; ++i) {
	if (marker[i] < *maxint) {
	    marker[i] = 0;
	}
/* L700: */
    }
L800:
    slu_mmdelm_(&mdnode, &xadj[1], &adjncy[1], &dhead[1], &invp[1], &perm[1], &
	    qsize[1], &llist[1], &marker[1], maxint, &tag);
    num += qsize[mdnode];
    llist[mdnode] = ehead;
    ehead = mdnode;
    if (*delta >= 0) {
	goto L500;
    }
L900:
/*            ------------------------------------------- */
/*            UPDATE DEGREES OF THE NODES INVOLVED IN THE */
/*            MINIMUM DEGREE NODES ELIMINATION. */
/*            ------------------------------------------- */
    if (num > *neqns) {
	goto L1000;
    }
    slu_mmdupd_(&ehead, neqns, &xadj[1], &adjncy[1], delta, &mdeg, &dhead[1], &
	    invp[1], &perm[1], &qsize[1], &llist[1], &marker[1], maxint, &tag)
	    ;
    goto L300;

L1000:
    slu_mmdnum_(neqns, &perm[1], &invp[1], &qsize[1]);
    return 0;

}